

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O0

void __thiscall
dg::SubgraphNode<dg::dda::RWNode>::insertBefore(SubgraphNode<dg::dda::RWNode> *this,RWNode *n)

{
  RWNode *pRVar1;
  bool bVar2;
  reference ppRVar3;
  ulong uVar4;
  size_t sVar5;
  reference ppRVar6;
  value_type in_RSI;
  SubgraphNode<dg::dda::RWNode> *in_RDI;
  uint i;
  RWNode *pred;
  iterator __end0;
  iterator __begin0;
  NodesVec *__range2;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffffa8;
  value_type in_stack_ffffffffffffffb0;
  RWNode *in_stack_ffffffffffffffb8;
  uint local_34;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  local_20;
  NodesVec *local_18;
  value_type local_10;
  
  local_10 = in_RSI;
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::swap
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)in_RDI,
             (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
             in_stack_ffffffffffffffb8);
  addSuccessor(in_RDI,in_stack_ffffffffffffffb8);
  local_18 = &in_RDI->_predecessors;
  local_20._M_current =
       (RWNode **)
       std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                 (in_stack_ffffffffffffffa8);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end(in_stack_ffffffffffffffa8)
  ;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar2) break;
    ppRVar3 = __gnu_cxx::
              __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
              ::operator*(&local_20);
    pRVar1 = *ppRVar3;
    local_34 = 0;
    while( true ) {
      uVar4 = (ulong)local_34;
      sVar5 = successorsNum((SubgraphNode<dg::dda::RWNode> *)0x1787a2);
      if (sVar5 <= uVar4) break;
      ppRVar6 = std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::operator[]
                          (&(pRVar1->super_SubgraphNode<dg::dda::RWNode>)._successors,
                           (ulong)local_34);
      if (*ppRVar6 == local_10) {
        in_stack_ffffffffffffffb0 = (value_type)&in_RDI[-1].size;
        ppRVar6 = std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::operator[]
                            (&(pRVar1->super_SubgraphNode<dg::dda::RWNode>)._successors,
                             (ulong)local_34);
        *ppRVar6 = in_stack_ffffffffffffffb0;
      }
      local_34 = local_34 + 1;
    }
    __gnu_cxx::
    __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void insertBefore(NodeT *n) {
        assert(n && "Passed nullptr as the node");
        assert(predecessorsNum() == 0);
        assert(successorsNum() == 0);

        // take over predecessors
        _predecessors.swap(n->_predecessors);

        // 'n' is a successors of this node
        addSuccessor(n);

        // replace the reference to n in predecessors
        for (NodeT *pred : _predecessors) {
            for (unsigned i = 0; i < pred->successorsNum(); ++i) {
                if (pred->_successors[i] == n)
                    pred->_successors[i] = static_cast<NodeT *>(this);
            }
        }
    }